

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_ArenaMergeFrom_Test::TestBody
          (ExtensionSetTest_ArenaMergeFrom_Test *this)

{
  TestAllExtensions *message;
  TestAllExtensions message2;
  Arena arena1;
  TestAllExtensions local_e0;
  ThreadSafeArena local_b0;
  
  ThreadSafeArena::ThreadSafeArena(&local_b0);
  message = (TestAllExtensions *)
            Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>((Arena *)&local_b0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(message);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_e0,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::MergeImpl((MessageLite *)&local_e0,(MessageLite *)message);
  ThreadSafeArena::Reset(&local_b0);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&local_e0);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_e0);
  ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(ExtensionSetTest, ArenaMergeFrom) {
  Arena arena1;
  unittest::TestAllExtensions* message1 =
      Arena::Create<unittest::TestAllExtensions>(&arena1);
  TestUtil::SetAllExtensions(message1);
  unittest::TestAllExtensions message2;
  message2.MergeFrom(*message1);
  arena1.Reset();
  TestUtil::ExpectAllExtensionsSet(message2);
}